

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall c4::yml::Parser::_prepare_locations(Parser *this)

{
  long lVar1;
  bool bVar2;
  error_flags eVar3;
  size_t sVar4;
  long *plVar5;
  long in_RDI;
  char msg [54];
  size_t i;
  size_t numnewlines;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  char *in_stack_ffffffffffffff18;
  Location *in_stack_ffffffffffffff20;
  undefined8 in_stack_ffffffffffffff28;
  char c;
  undefined1 *puVar6;
  basic_substring<char> *in_stack_ffffffffffffff30;
  code *pcVar7;
  undefined1 local_88 [64];
  ulong local_48;
  long local_40;
  ro_substr local_38;
  char *local_20;
  undefined4 local_18;
  ulong local_10;
  long *local_8;
  
  c = (char)((ulong)in_stack_ffffffffffffff28 >> 0x38);
  local_38 = basic_substring::operator_cast_to_basic_substring((basic_substring<char> *)0x398e55);
  *(char **)(in_RDI + 0xaa0) = local_38.str;
  *(size_t *)(in_RDI + 0xaa8) = local_38.len;
  sVar4 = basic_substring<char>::count
                    (in_stack_ffffffffffffff30,c,(size_t)in_stack_ffffffffffffff20);
  local_40 = sVar4 + 1;
  _resize_locations((Parser *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                    CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  *(undefined8 *)(in_RDI + 0xa90) = 0;
  for (local_48 = 0; local_48 < *(ulong *)(in_RDI + 0x20); local_48 = local_48 + 1) {
    plVar5 = (long *)(in_RDI + 0x18);
    local_10 = local_48;
    local_8 = plVar5;
    if (*(ulong *)(in_RDI + 0x20) <= local_48) {
      eVar3 = get_error_flags();
      if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
        trap_instruction();
      }
      local_20 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_18 = 0x14c3;
      handle_error(0x3f0daf,(char *)0x14c3,"check failed: %s","i >= 0 && i < len");
    }
    if (*(char *)(*plVar5 + local_10) == '\n') {
      lVar1 = *(long *)(in_RDI + 0xa90);
      *(long *)(in_RDI + 0xa90) = lVar1 + 1;
      *(ulong *)(*(long *)(in_RDI + 0xa88) + lVar1 * 8) = local_48;
    }
  }
  lVar1 = *(long *)(in_RDI + 0xa90);
  *(long *)(in_RDI + 0xa90) = lVar1 + 1;
  *(undefined8 *)(*(long *)(in_RDI + 0xa88) + lVar1 * 8) = *(undefined8 *)(in_RDI + 0x20);
  if (*(long *)(in_RDI + 0xa90) != local_40) {
    memcpy(local_88,"check failed: (m_newline_offsets_size == numnewlines)",0x36);
    eVar3 = get_error_flags();
    if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
      trap_instruction();
    }
    pcVar7 = *(code **)(in_RDI + 0x9e8);
    puVar6 = local_88;
    Location::Location(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                       CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                       CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                       CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
    (*pcVar7)(puVar6,0x36,*(undefined8 *)(in_RDI + 0x9d0));
  }
  return;
}

Assistant:

void Parser::_prepare_locations()
{
    m_newline_offsets_buf = m_buf;
    size_t numnewlines = 1u + m_buf.count('\n');
    _resize_locations(numnewlines);
    m_newline_offsets_size = 0;
    for(size_t i = 0; i < m_buf.len; i++)
        if(m_buf[i] == '\n')
            m_newline_offsets[m_newline_offsets_size++] = i;
    m_newline_offsets[m_newline_offsets_size++] = m_buf.len;
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_newline_offsets_size == numnewlines);
}